

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_c8 [21];
  uchar buffer_value [3];
  MockCheckedExpectedCall expectedCall;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall(&expectedCall,1);
  SimpleString::SimpleString((SimpleString *)local_c8,"name");
  MockCheckedExpectedCall::withName(&expectedCall,(SimpleString *)local_c8);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"string");
  (*expectedCall.super_MockExpectedCall._vptr_MockExpectedCall[0x13])
            (&expectedCall,local_c8,"value");
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"integer");
  (*expectedCall.super_MockExpectedCall._vptr_MockExpectedCall[0xb])(&expectedCall,local_c8,10);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"unsigned-integer");
  (*expectedCall.super_MockExpectedCall._vptr_MockExpectedCall[0xc])(&expectedCall,local_c8,7);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  SimpleString::SimpleString((SimpleString *)local_c8,"buffer");
  MockCheckedExpectedCall::withOutputParameterReturning
            (&expectedCall,(SimpleString *)local_c8,buffer_value,3);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  MockCheckedExpectedCall::callWasMade(&expectedCall,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_c8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_c8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)>, const void* buffer: <output> (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x25b,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_c8);
  MockCheckedExpectedCall::~MockCheckedExpectedCall(&expectedCall);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleInputAndOutputParameters)
{
    int int_value = 10;
    unsigned int uint_value = 7;
    unsigned char buffer_value[3];

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.withParameter("integer", int_value);
    expectedCall.withParameter("unsigned-integer", uint_value);
    expectedCall.withOutputParameterReturning("buffer", buffer_value, sizeof(buffer_value));
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)>, "
                 "const void* buffer: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}